

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

arg_rem * arg_rem(char *datatype,char *glossary)

{
  arg_rem *paVar1;
  
  paVar1 = (arg_rem *)malloc(0x60);
  if (paVar1 != (arg_rem *)0x0) {
    (paVar1->hdr).flag = '\0';
    (paVar1->hdr).shortopts = (char *)0x0;
    (paVar1->hdr).longopts = (char *)0x0;
    (paVar1->hdr).datatype = datatype;
    (paVar1->hdr).glossary = glossary;
    (paVar1->hdr).mincount = 1;
    (paVar1->hdr).maxcount = 1;
    (paVar1->hdr).parent = paVar1;
    (paVar1->hdr).resetfn = (arg_resetfn *)0x0;
    (paVar1->hdr).scanfn = (arg_scanfn *)0x0;
    (paVar1->hdr).checkfn = (arg_checkfn *)0x0;
    (paVar1->hdr).errorfn = (arg_errorfn *)0x0;
  }
  return paVar1;
}

Assistant:

struct arg_rem * arg_rem(const char * datatype, const char * glossary) {
	struct arg_rem * result = (struct arg_rem *)malloc(sizeof(struct arg_rem));

	if (result) {
		result->hdr.flag = 0;
		result->hdr.shortopts = NULL;
		result->hdr.longopts = NULL;
		result->hdr.datatype = datatype;
		result->hdr.glossary = glossary;
		result->hdr.mincount = 1;
		result->hdr.maxcount = 1;
		result->hdr.parent = result;
		result->hdr.resetfn = NULL;
		result->hdr.scanfn = NULL;
		result->hdr.checkfn = NULL;
		result->hdr.errorfn = NULL;
	}

	ARG_TRACE(("arg_rem() returns %p\n", result));
	return result;
}